

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pnm(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  FILE *pFVar5;
  undefined1 uVar6;
  uchar uVar7;
  bool bVar8;
  int iVar9;
  CImgArgumentException *this_00;
  char *pcVar10;
  char *pcVar11;
  CImgIOException *pCVar12;
  ulongT uVar13;
  uint *puVar14;
  undefined1 *puVar15;
  undefined2 *puVar16;
  uchar *puVar17;
  char *local_4b0;
  char *local_420;
  char *local_3d8;
  char *local_388;
  FILE *local_338;
  ulong local_2f8;
  ulongT off_8;
  float *ptrs_6;
  longT to_read_6;
  uchar *ptrd_7;
  CImg<float> raw_6;
  ulongT off_7;
  int *ptrs_5;
  longT to_read_5;
  uchar *ptrd_6;
  CImg<int> raw_5;
  ulongT off_6;
  unsigned_short *ptrs_4;
  ulongT local_260;
  longT to_read_4;
  uchar *ptr_b_2;
  uchar *ptr_g_2;
  uchar *ptr_r_1;
  CImg<unsigned_short> raw_4;
  ulongT off_5;
  uchar *ptrs_3;
  longT to_read_3;
  uchar *ptr_b_1;
  uchar *ptr_g_1;
  uchar *ptr_r;
  CImg<unsigned_char> raw_3;
  ulongT off_4;
  unsigned_short *ptrs_2;
  ulongT local_1b8;
  longT to_read_2;
  uchar *ptrd_5;
  CImg<unsigned_short> raw_2;
  ulongT off_3;
  uchar *ptrs_1;
  longT to_read_1;
  uchar *ptrd_4;
  CImg<unsigned_char> raw_1;
  ulongT off_2;
  uchar val;
  byte *pbStack_138;
  uchar mask;
  uchar *ptrs;
  longT to_read;
  uint local_120;
  uint d;
  uint h;
  uint w;
  uchar *ptrd_3;
  CImg<unsigned_char> raw;
  int x;
  int y;
  uchar *ptr_b;
  uchar *ptr_g;
  uchar *ptrd_2;
  unsigned_long _maxoff_1;
  unsigned_long off_1;
  uchar *ptrd_1;
  unsigned_long _maxoff;
  unsigned_long off;
  uchar *ptrd;
  longT cimg_iobuffer;
  undefined1 local_90 [4];
  int bval;
  int gval;
  int rval;
  int err;
  CImg<char> item;
  uint local_58;
  uint colormax;
  uint D;
  uint H;
  uint W;
  uint ppm_type;
  FILE *nfile;
  char *local_30;
  char *filename_local;
  FILE *file_local;
  CImg<unsigned_char> *this_local;
  
  local_30 = filename;
  filename_local = (char *)file;
  file_local = (FILE *)this;
  if ((file == (FILE *)0x0) && (filename == (char *)0x0)) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar17 = this->_data;
    pcVar10 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar10 = "";
    }
    pcVar11 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar17,pcVar10,pcVar11);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_338 = (FILE *)file;
  if (file == (FILE *)0x0) {
    local_338 = cimg::fopen(filename,"rb");
  }
  _W = local_338;
  local_58 = 1;
  item._data._4_4_ = 0xff;
  rval._3_1_ = 0;
  CImg<char>::CImg((CImg<char> *)&err,0x4000,1,1,1,(char *)((long)&rval + 3));
  ptrd = (uchar *)0x1800000;
  while( true ) {
    pFVar5 = _W;
    pcVar10 = CImg<char>::data((CImg<char> *)&err);
    gval = __isoc99_fscanf(pFVar5,"%16383[^\n]",pcVar10);
    bVar8 = false;
    if (gval != -1) {
      pcVar10 = cimg_library::CImg::operator_cast_to_char_((CImg *)&err);
      bVar8 = *pcVar10 == '#' || gval == 0;
    }
    if (!bVar8) break;
    fgetc(_W);
  }
  pcVar10 = cimg_library::CImg::operator_cast_to_char_((CImg *)&err);
  iVar9 = __isoc99_sscanf(pcVar10," P%u",&H);
  if (iVar9 != 1) {
    if (filename_local == (char *)0x0) {
      cimg::fclose(_W);
    }
    pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar17 = this->_data;
    pcVar10 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar10 = "";
    }
    pcVar11 = pixel_type();
    if (local_30 == (char *)0x0) {
      local_388 = "(FILE*)";
    }
    else {
      local_388 = local_30;
    }
    CImgIOException::CImgIOException
              (pCVar12,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): PNM header not found in file \'%s\'."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar17,pcVar10,pcVar11,
               local_388);
    __cxa_throw(pCVar12,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  while( true ) {
    pFVar5 = _W;
    pcVar10 = CImg<char>::data((CImg<char> *)&err);
    gval = __isoc99_fscanf(pFVar5," %16383[^\n]",pcVar10);
    bVar8 = false;
    if (gval != -1) {
      pcVar10 = cimg_library::CImg::operator_cast_to_char_((CImg *)&err);
      bVar8 = *pcVar10 == '#' || gval == 0;
    }
    if (!bVar8) break;
    fgetc(_W);
  }
  pcVar10 = cimg_library::CImg::operator_cast_to_char_((CImg *)&err);
  gval = __isoc99_sscanf(pcVar10," %u %u %u %u",&D,&colormax,&local_58,
                         (undefined1 *)((long)&item._data + 4));
  if (gval < 2) {
    if (filename_local == (char *)0x0) {
      cimg::fclose(_W);
    }
    pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar17 = this->_data;
    pcVar10 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar10 = "";
    }
    pcVar11 = pixel_type();
    if (local_30 == (char *)0x0) {
      local_3d8 = "(FILE*)";
    }
    else {
      local_3d8 = local_30;
    }
    CImgIOException::CImgIOException
              (pCVar12,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): WIDTH and HEIGHT fields undefined in file \'%s\'."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar17,pcVar10,pcVar11,
               local_3d8);
    __cxa_throw(pCVar12,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  if ((H != 1) && (H != 4)) {
    if ((gval == 2) || ((gval == 3 && ((((H == 5 || (H == 7)) || (H == 8)) || (H == 9)))))) {
      while( true ) {
        pFVar5 = _W;
        pcVar10 = CImg<char>::data((CImg<char> *)&err);
        gval = __isoc99_fscanf(pFVar5," %16383[^\n]",pcVar10);
        bVar8 = false;
        if (gval != -1) {
          pcVar10 = cimg_library::CImg::operator_cast_to_char_((CImg *)&err);
          bVar8 = *pcVar10 == '#' || gval == 0;
        }
        if (!bVar8) break;
        fgetc(_W);
      }
      pcVar10 = cimg_library::CImg::operator_cast_to_char_((CImg *)&err);
      iVar9 = __isoc99_sscanf(pcVar10,"%u",(undefined1 *)((long)&item._data + 4));
      if (iVar9 != 1) {
        uVar1 = this->_width;
        uVar2 = this->_height;
        uVar3 = this->_depth;
        uVar4 = this->_spectrum;
        puVar17 = this->_data;
        pcVar10 = "non-";
        if ((this->_is_shared & 1U) != 0) {
          pcVar10 = "";
        }
        pcVar11 = pixel_type();
        if (local_30 == (char *)0x0) {
          local_420 = "(FILE*)";
        }
        else {
          local_420 = local_30;
        }
        cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): COLORMAX field is undefined in file \'%s\'."
                   ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar17,pcVar10,pcVar11,
                   local_420);
      }
    }
    else {
      item._data._4_4_ = local_58;
      local_58 = 1;
    }
  }
  fgetc(_W);
  switch(H) {
  case 1:
    assign(this,D,colormax,1,1);
    off = (unsigned_long)this->_data;
    _maxoff = 0;
    uVar13 = size(this);
    while ((_maxoff < uVar13 && (iVar9 = __isoc99_fscanf(_W,"%d",&bval), 0 < iVar9))) {
      uVar6 = 0xff;
      if (bval != 0) {
        uVar6 = 0;
      }
      *(undefined1 *)off = uVar6;
      _maxoff = _maxoff + 1;
      off = off + 1;
    }
    break;
  case 2:
    assign(this,D,colormax,1,1);
    off_1 = (unsigned_long)this->_data;
    _maxoff_1 = 0;
    uVar13 = size(this);
    while ((_maxoff_1 < uVar13 && (iVar9 = __isoc99_fscanf(_W,"%d",&bval), 0 < iVar9))) {
      *(char *)off_1 = (char)bval;
      _maxoff_1 = _maxoff_1 + 1;
      off_1 = off_1 + 1;
    }
    break;
  case 3:
    assign(this,D,colormax,1,3);
    ptr_g = data(this,0,0,0,0);
    ptr_b = data(this,0,0,0,1);
    _x = data(this,0,0,0,2);
    for (raw._data._4_4_ = 0; raw._data._4_4_ < (int)this->_height;
        raw._data._4_4_ = raw._data._4_4_ + 1) {
      raw._data._0_4_ = 0;
      while (((int)raw._data < (int)this->_width &&
             (iVar9 = __isoc99_fscanf(_W,"%d %d %d",&bval,local_90,(long)&cimg_iobuffer + 4),
             iVar9 == 3))) {
        *ptr_g = (uchar)bval;
        *ptr_b = local_90[0];
        *_x = (uchar)cimg_iobuffer._4_4_;
        raw._data._0_4_ = (int)raw._data + 1;
        _x = _x + 1;
        ptr_b = ptr_b + 1;
        ptr_g = ptr_g + 1;
      }
    }
    break;
  case 4:
    CImg((CImg<unsigned_char> *)&ptrd_3);
    assign(this,D,colormax,local_58,1);
    _h = data(this,0,0,0,0);
    d = 0;
    local_120 = 0;
    to_read._4_4_ = 0;
    ptrs = (uchar *)(ulong)(((D >> 3) + (uint)((D & 7) != 0)) * colormax * local_58);
LAB_001f7996:
    if (0 < (long)ptrs) {
      puVar14 = (uint *)std::min<long>((long *)&ptrs,(long *)&ptrd);
      assign((CImg<unsigned_char> *)&ptrd_3,*puVar14,1,1,1);
      cimg::fread<unsigned_char>((uchar *)raw._16_8_,(ulong)(uint)ptrd_3,(FILE *)_W);
      ptrs = ptrs + -(ulong)(uint)ptrd_3;
      pbStack_138 = (byte *)raw._16_8_;
      off_2._6_1_ = 0;
      raw_1._data = (uchar *)(ulong)(uint)ptrd_3;
      for (off_2._7_1_ = 0; raw_1._data != (uchar *)0x0 || off_2._7_1_ != 0;
          off_2._7_1_ = (byte)((int)(uint)off_2._7_1_ >> 1)) {
        if (off_2._7_1_ == 0) {
          if (raw_1._data != (uchar *)0x0) {
            off_2._6_1_ = *pbStack_138;
            pbStack_138 = pbStack_138 + 1;
          }
          off_2._7_1_ = 0x80;
          raw_1._data = raw_1._data + -1;
        }
        uVar7 = 0xff;
        if ((off_2._6_1_ & off_2._7_1_) != 0) {
          uVar7 = '\0';
        }
        puVar17 = _h + 1;
        *_h = uVar7;
        d = d + 1;
        _h = puVar17;
        if (d == D) {
          d = 0;
          off_2._7_1_ = 0;
          local_120 = local_120 + 1;
          if (local_120 == colormax) {
            local_120 = 0;
            to_read._4_4_ = to_read._4_4_ + 1;
            if (to_read._4_4_ == local_58) break;
          }
        }
      }
      goto LAB_001f7996;
    }
    ~CImg((CImg<unsigned_char> *)&ptrd_3);
    break;
  case 5:
  case 7:
    if (item._data._4_4_ < 0x100) {
      CImg((CImg<unsigned_char> *)&ptrd_4);
      assign(this,D,colormax,local_58,1);
      to_read_1 = (longT)data(this,0,0,0,0);
      ptrs_1 = (uchar *)size(this);
      while (0 < (long)ptrs_1) {
        puVar14 = (uint *)std::min<long>((long *)&ptrs_1,(long *)&ptrd);
        assign((CImg<unsigned_char> *)&ptrd_4,*puVar14,1,1,1);
        cimg::fread<unsigned_char>((uchar *)raw_1._16_8_,(ulong)(uint)ptrd_4,(FILE *)_W);
        ptrs_1 = ptrs_1 + -(ulong)(uint)ptrd_4;
        off_3 = raw_1._16_8_;
        for (raw_2._data = (unsigned_short *)(ulong)(uint)ptrd_4;
            raw_2._data != (unsigned_short *)0x0;
            raw_2._data = (unsigned_short *)((long)raw_2._data + -1)) {
          *(undefined1 *)to_read_1 = *(undefined1 *)off_3;
          off_3 = off_3 + 1;
          to_read_1 = to_read_1 + 1;
        }
      }
      ~CImg((CImg<unsigned_char> *)&ptrd_4);
    }
    else {
      CImg<unsigned_short>::CImg((CImg<unsigned_short> *)&ptrd_5);
      assign(this,D,colormax,local_58,1);
      to_read_2 = (longT)data(this,0,0,0,0);
      local_1b8 = size(this);
      while (0 < (long)local_1b8) {
        ptrs_2 = (unsigned_short *)0xc00000;
        puVar14 = (uint *)std::min<long>((long *)&local_1b8,(long *)&ptrs_2);
        CImg<unsigned_short>::assign((CImg<unsigned_short> *)&ptrd_5,*puVar14,1,1,1);
        cimg::fread<unsigned_short>((unsigned_short *)raw_2._16_8_,(ulong)(uint)ptrd_5,(FILE *)_W);
        bVar8 = cimg::endianness();
        if (!bVar8) {
          cimg::invert_endianness<unsigned_short>
                    ((unsigned_short *)raw_2._16_8_,(ulong)(uint)ptrd_5);
        }
        local_1b8 = local_1b8 - (uint)ptrd_5;
        off_4 = raw_2._16_8_;
        for (raw_3._data = (uchar *)(ulong)(uint)ptrd_5; raw_3._data != (uchar *)0x0;
            raw_3._data = raw_3._data + -1) {
          *(char *)to_read_2 = (char)*(undefined2 *)off_4;
          off_4 = off_4 + 2;
          to_read_2 = to_read_2 + 1;
        }
      }
      CImg<unsigned_short>::~CImg((CImg<unsigned_short> *)&ptrd_5);
    }
    break;
  case 6:
    if (item._data._4_4_ < 0x100) {
      CImg((CImg<unsigned_char> *)&ptr_r);
      assign(this,D,colormax,1,3);
      ptr_g_1 = data(this,0,0,0,0);
      ptr_b_1 = data(this,0,0,0,1);
      to_read_3 = (longT)data(this,0,0,0,2);
      ptrs_3 = (uchar *)size(this);
      while (0 < (long)ptrs_3) {
        puVar14 = (uint *)std::min<long>((long *)&ptrs_3,(long *)&ptrd);
        assign((CImg<unsigned_char> *)&ptr_r,*puVar14,1,1,1);
        cimg::fread<unsigned_char>((uchar *)raw_3._16_8_,(ulong)(uint)ptr_r,(FILE *)_W);
        ptrs_3 = ptrs_3 + -(ulong)(uint)ptr_r;
        off_5 = raw_3._16_8_;
        for (raw_4._data = (unsigned_short *)((ulong)(uint)ptr_r / 3);
            raw_4._data != (unsigned_short *)0x0;
            raw_4._data = (unsigned_short *)((long)raw_4._data + -1)) {
          *ptr_g_1 = *(uchar *)off_5;
          puVar15 = (undefined1 *)(off_5 + 2);
          *ptr_b_1 = *(uchar *)(off_5 + 1);
          off_5 = off_5 + 3;
          *(undefined1 *)to_read_3 = *puVar15;
          to_read_3 = to_read_3 + 1;
          ptr_b_1 = ptr_b_1 + 1;
          ptr_g_1 = ptr_g_1 + 1;
        }
      }
      ~CImg((CImg<unsigned_char> *)&ptr_r);
    }
    else {
      CImg<unsigned_short>::CImg((CImg<unsigned_short> *)&ptr_r_1);
      assign(this,D,colormax,1,3);
      ptr_g_2 = data(this,0,0,0,0);
      ptr_b_2 = data(this,0,0,0,1);
      to_read_4 = (longT)data(this,0,0,0,2);
      local_260 = size(this);
      while (0 < (long)local_260) {
        ptrs_4 = (unsigned_short *)0xc00000;
        puVar14 = (uint *)std::min<long>((long *)&local_260,(long *)&ptrs_4);
        CImg<unsigned_short>::assign((CImg<unsigned_short> *)&ptr_r_1,*puVar14,1,1,1);
        cimg::fread<unsigned_short>((unsigned_short *)raw_4._16_8_,(ulong)(uint)ptr_r_1,(FILE *)_W);
        bVar8 = cimg::endianness();
        if (!bVar8) {
          cimg::invert_endianness<unsigned_short>
                    ((unsigned_short *)raw_4._16_8_,(ulong)(uint)ptr_r_1);
        }
        local_260 = local_260 - (uint)ptr_r_1;
        off_6 = raw_4._16_8_;
        for (raw_5._data = (int *)((ulong)(uint)ptr_r_1 / 3); raw_5._data != (int *)0x0;
            raw_5._data = (int *)((long)raw_5._data + -1)) {
          *ptr_g_2 = (uchar)*(undefined2 *)off_6;
          puVar16 = (undefined2 *)(off_6 + 4);
          *ptr_b_2 = (uchar)*(undefined2 *)(off_6 + 2);
          off_6 = off_6 + 6;
          *(char *)to_read_4 = (char)*puVar16;
          to_read_4 = to_read_4 + 1;
          ptr_b_2 = ptr_b_2 + 1;
          ptr_g_2 = ptr_g_2 + 1;
        }
      }
      CImg<unsigned_short>::~CImg((CImg<unsigned_short> *)&ptr_r_1);
    }
    break;
  case 8:
    CImg<int>::CImg((CImg<int> *)&ptrd_6);
    assign(this,D,colormax,local_58,1);
    to_read_5 = (longT)data(this,0,0,0,0);
    ptrs_5 = (int *)size(this);
    while (0 < (long)ptrs_5) {
      puVar14 = (uint *)std::min<long>((long *)&ptrs_5,(long *)&ptrd);
      CImg<int>::assign((CImg<int> *)&ptrd_6,*puVar14,1,1,1);
      cimg::fread<int>((int *)raw_5._16_8_,(ulong)(uint)ptrd_6,(FILE *)_W);
      ptrs_5 = (int *)((long)ptrs_5 - (ulong)(uint)ptrd_6);
      off_7 = raw_5._16_8_;
      for (raw_6._data = (float *)(ulong)(uint)ptrd_6; raw_6._data != (float *)0x0;
          raw_6._data = (float *)((long)raw_6._data + -1)) {
        *(char *)to_read_5 = (char)*(undefined4 *)off_7;
        off_7 = off_7 + 4;
        to_read_5 = to_read_5 + 1;
      }
    }
    CImg<int>::~CImg((CImg<int> *)&ptrd_6);
    break;
  case 9:
    CImg<float>::CImg((CImg<float> *)&ptrd_7);
    assign(this,D,colormax,local_58,1);
    to_read_6 = (longT)data(this,0,0,0,0);
    ptrs_6 = (float *)size(this);
    while (0 < (long)ptrs_6) {
      puVar14 = (uint *)std::min<long>((long *)&ptrs_6,(long *)&ptrd);
      CImg<float>::assign((CImg<float> *)&ptrd_7,*puVar14,1,1,1);
      cimg::fread<float>((float *)raw_6._16_8_,(ulong)(uint)ptrd_7,(FILE *)_W);
      ptrs_6 = (float *)((long)ptrs_6 - (ulong)(uint)ptrd_7);
      off_8 = raw_6._16_8_;
      for (local_2f8 = (ulong)(uint)ptrd_7; local_2f8 != 0; local_2f8 = local_2f8 - 1) {
        *(char *)to_read_6 = (char)(int)*(float *)off_8;
        off_8 = off_8 + 4;
        to_read_6 = to_read_6 + 1;
      }
    }
    CImg<float>::~CImg((CImg<float> *)&ptrd_7);
    break;
  default:
    assign(this);
    if (filename_local == (char *)0x0) {
      cimg::fclose(_W);
    }
    pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar17 = this->_data;
    pcVar10 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar10 = "";
    }
    pcVar11 = pixel_type();
    if (local_30 == (char *)0x0) {
      local_4b0 = "(FILE*)";
    }
    else {
      local_4b0 = local_30;
    }
    CImgIOException::CImgIOException
              (pCVar12,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): PNM type \'P%d\' found, but type is not supported."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar17,pcVar10,pcVar11,
               local_4b0,H);
    __cxa_throw(pCVar12,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  if (filename_local == (char *)0x0) {
    cimg::fclose(_W);
  }
  CImg<char>::~CImg((CImg<char> *)&err);
  return this;
}

Assistant:

CImg<T>& _load_pnm(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pnm(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      unsigned int ppm_type, W, H, D = 1, colormax = 255;
      CImg<charT> item(16384,1,1,1,0);
      int err, rval, gval, bval;
      const longT cimg_iobuffer = (longT)24*1024*1024;
      while ((err=std::fscanf(nfile,"%16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if (cimg_sscanf(item," P%u",&ppm_type)!=1) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): PNM header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if ((err=cimg_sscanf(item," %u %u %u %u",&W,&H,&D,&colormax))<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): WIDTH and HEIGHT fields undefined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (ppm_type!=1 && ppm_type!=4) {
        if (err==2 || (err==3 && (ppm_type==5 || ppm_type==7 || ppm_type==8 || ppm_type==9))) {
          while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
          if (cimg_sscanf(item,"%u",&colormax)!=1)
            cimg::warn(_cimg_instance
                       "load_pnm(): COLORMAX field is undefined in file '%s'.",
                       cimg_instance,
                       filename?filename:"(FILE*)");
        } else { colormax = D; D = 1; }
      }
      std::fgetc(nfile);

      switch (ppm_type) {
      case 1 : { // 2D b&w Ascii
        assign(W,H,1,1);
        T* ptrd = _data;
        cimg_foroff(*this,off) { if (std::fscanf(nfile,"%d",&rval)>0) *(ptrd++) = (T)(rval?0:255); else break; }
      } break;
      case 2 : { // 2D grey Ascii
        assign(W,H,1,1);
        T* ptrd = _data;
        cimg_foroff(*this,off) { if (std::fscanf(nfile,"%d",&rval)>0) *(ptrd++) = (T)rval; else break; }
      } break;
      case 3 : { // 2D color Ascii
        assign(W,H,1,3);
        T *ptrd = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
        cimg_forXY(*this,x,y) {
          if (std::fscanf(nfile,"%d %d %d",&rval,&gval,&bval)==3) {
            *(ptrd++) = (T)rval; *(ptr_g++) = (T)gval; *(ptr_b++) = (T)bval;
          } else break;
        }
      } break;
      case 4 : { // 2D b&w binary (support 3D PINK extension)
        CImg<ucharT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        unsigned int w = 0, h = 0, d = 0;
        for (longT to_read = (longT)((W/8 + (W%8?1:0))*H*D); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const unsigned char *ptrs = raw._data;
          unsigned char mask = 0, val = 0;
          for (ulongT off = (ulongT)raw._width; off || mask; mask>>=1) {
            if (!mask) { if (off--) val = *(ptrs++); mask = 128; }
            *(ptrd++) = (T)((val&mask)?0:255);
            if (++w==W) { w = 0; mask = 0; if (++h==H) { h = 0; if (++d==D) break; }}
          }
        }
      } break;
      case 5 : case 7 : { // 2D/3D grey binary (support 3D PINK extension)
        if (colormax<256) { // 8 bits
          CImg<ucharT> raw;
          assign(W,H,D,1);
          T *ptrd = data(0,0,0,0);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer));
            cimg::fread(raw._data,raw._width,nfile);
            to_read-=raw._width;
            const unsigned char *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
          }
        } else { // 16 bits
          CImg<ushortT> raw;
          assign(W,H,D,1);
          T *ptrd = data(0,0,0,0);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer/2));
            cimg::fread(raw._data,raw._width,nfile);
	    if (!cimg::endianness()) cimg::invert_endianness(raw._data,raw._width);
            to_read-=raw._width;
            const unsigned short *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
          }
        }
      } break;
      case 6 : { // 2D color binary
        if (colormax<256) { // 8 bits
          CImg<ucharT> raw;
          assign(W,H,1,3);
          T
            *ptr_r = data(0,0,0,0),
            *ptr_g = data(0,0,0,1),
            *ptr_b = data(0,0,0,2);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer));
            cimg::fread(raw._data,raw._width,nfile);
            to_read-=raw._width;
            const unsigned char *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width/3; off; --off) {
              *(ptr_r++) = (T)*(ptrs++);
              *(ptr_g++) = (T)*(ptrs++);
              *(ptr_b++) = (T)*(ptrs++);
            }
          }
        } else { // 16 bits
          CImg<ushortT> raw;
          assign(W,H,1,3);
          T
            *ptr_r = data(0,0,0,0),
            *ptr_g = data(0,0,0,1),
            *ptr_b = data(0,0,0,2);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer/2));
            cimg::fread(raw._data,raw._width,nfile);
            if (!cimg::endianness()) cimg::invert_endianness(raw._data,raw._width);
            to_read-=raw._width;
            const unsigned short *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width/3; off; --off) {
              *(ptr_r++) = (T)*(ptrs++);
              *(ptr_g++) = (T)*(ptrs++);
              *(ptr_b++) = (T)*(ptrs++);
            }
          }
        }
      } break;
      case 8 : { // 2D/3D grey binary with int32 integers (PINK extension)
        CImg<intT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        for (longT to_read = (longT)size(); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const int *ptrs = raw._data;
          for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
        }
      } break;
      case 9 : { // 2D/3D grey binary with float values (PINK extension)
        CImg<floatT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        for (longT to_read = (longT)size(); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const float *ptrs = raw._data;
          for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
        }
      } break;
      default :
        assign();
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): PNM type 'P%d' found, but type is not supported.",
                              cimg_instance,
                              filename?filename:"(FILE*)",ppm_type);
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }